

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

int mbedtls_des3_crypt_cbc
              (mbedtls_des3_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output
              )

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = -0x32;
  if ((length & 7) == 0) {
    if (mode == 1) {
      if (length != 0) {
        do {
          lVar3 = 0;
          do {
            output[lVar3] = iv[lVar3] ^ input[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
          mbedtls_des3_crypt_ecb(ctx,output,output);
          *(undefined8 *)iv = *(undefined8 *)output;
          input = input + 8;
          output = output + 8;
          length = length - 8;
        } while (length != 0);
      }
    }
    else if (length != 0) {
      do {
        uVar1 = *(undefined8 *)input;
        mbedtls_des3_crypt_ecb(ctx,input,output);
        lVar3 = 0;
        do {
          output[lVar3] = output[lVar3] ^ iv[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        *(undefined8 *)iv = uVar1;
        input = input + 8;
        output = output + 8;
        length = length - 8;
      } while (length != 0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_des3_crypt_cbc( mbedtls_des3_context *ctx,
                     int mode,
                     size_t length,
                     unsigned char iv[8],
                     const unsigned char *input,
                     unsigned char *output )
{
    int i;
    unsigned char temp[8];

    if( length % 8 )
        return( MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH );

    if( mode == MBEDTLS_DES_ENCRYPT )
    {
        while( length > 0 )
        {
            for( i = 0; i < 8; i++ )
                output[i] = (unsigned char)( input[i] ^ iv[i] );

            mbedtls_des3_crypt_ecb( ctx, output, output );
            memcpy( iv, output, 8 );

            input  += 8;
            output += 8;
            length -= 8;
        }
    }
    else /* MBEDTLS_DES_DECRYPT */
    {
        while( length > 0 )
        {
            memcpy( temp, input, 8 );
            mbedtls_des3_crypt_ecb( ctx, input, output );

            for( i = 0; i < 8; i++ )
                output[i] = (unsigned char)( output[i] ^ iv[i] );

            memcpy( iv, temp, 8 );

            input  += 8;
            output += 8;
            length -= 8;
        }
    }

    return( 0 );
}